

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_>::push_back
          (vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_> *this,Shape *value)

{
  size_t in_RDI;
  vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_> *unaff_retaddr;
  Shape *in_stack_ffffffffffffffd8;
  polymorphic_allocator<pbrt::Shape> *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x10) == *(long *)(in_RDI + 0x18)) {
    if (*(long *)(in_RDI + 0x10) == 0) {
      in_stack_ffffffffffffffe0 = (polymorphic_allocator<pbrt::Shape> *)0x4;
    }
    else {
      in_stack_ffffffffffffffe0 =
           (polymorphic_allocator<pbrt::Shape> *)(*(long *)(in_RDI + 0x10) << 1);
    }
    reserve(unaff_retaddr,in_RDI);
  }
  pmr::polymorphic_allocator<pbrt::Shape>::construct<pbrt::Shape,pbrt::Shape_const&>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(Shape *)0x4ca498);
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  return;
}

Assistant:

void push_back(const T &value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, value);
        ++nStored;
    }